

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

int64_t archive_write_disk_gid(archive *_a,char *name,int64_t id)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  int64_t iVar2;
  
  iVar1 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_gid");
  iVar2 = -0x1e;
  if ((iVar1 != -0x1e) &&
     (UNRECOVERED_JUMPTABLE = (code *)_a[1].error_string.s, iVar2 = id,
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    iVar2 = (*UNRECOVERED_JUMPTABLE)(_a[1].error_string.buffer_length,name,id);
    return iVar2;
  }
  return iVar2;
}

Assistant:

int64_t
archive_write_disk_gid(struct archive *_a, const char *name, int64_t id)
{
       struct archive_write_disk *a = (struct archive_write_disk *)_a;
       archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
           ARCHIVE_STATE_ANY, "archive_write_disk_gid");
       if (a->lookup_gid)
               return (a->lookup_gid)(a->lookup_gid_data, name, id);
       return (id);
}